

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

string * __thiscall
cs_impl::any::holder<cs::structure>::to_string_abi_cxx11_(holder<cs::structure> *this)

{
  string *in_RDI;
  structure *in_stack_000000d8;
  
  to_string<cs::structure>(in_stack_000000d8);
  return in_RDI;
}

Assistant:

std::string to_string() const override
			{
				return cs_impl::to_string(mDat);
			}